

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O1

void __thiscall duckdb::LogicalGet::Serialize(LogicalGet *this,Serializer *serializer)

{
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"table_index");
  (*serializer->_vptr_Serializer[0x15])(serializer,this->table_index);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"returned_types");
  Serializer::WriteValue<duckdb::LogicalType>(serializer,&this->returned_types);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xca,"names");
  Serializer::WriteValue<std::__cxx11::string>(serializer,&this->names);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xcc,"projection_ids");
  Serializer::WriteValue<unsigned_long>(serializer,&this->projection_ids);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WriteProperty<duckdb::TableFilterSet>
            (serializer,0xcd,"table_filters",&this->table_filters);
  FunctionSerializer::Serialize<duckdb::TableFunction>
            (serializer,&this->function,
             (optional_ptr<duckdb::FunctionData,_true>)
             (this->bind_data).
             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl);
  if ((this->function).serialize == (table_function_serialize_t)0x0) {
    (*serializer->_vptr_Serializer[2])(serializer,0xce,"parameters");
    Serializer::WriteValue<duckdb::Value>(serializer,&this->parameters);
    (*serializer->_vptr_Serializer[3])(serializer);
    (*serializer->_vptr_Serializer[2])(serializer,0xcf,"named_parameters");
    Serializer::
    WriteValue<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality>
              (serializer,&this->named_parameters);
    (*serializer->_vptr_Serializer[3])(serializer);
    (*serializer->_vptr_Serializer[2])(serializer,0xd0,"input_table_types");
    Serializer::WriteValue<duckdb::LogicalType>(serializer,&this->input_table_types);
    (*serializer->_vptr_Serializer[3])(serializer);
    (*serializer->_vptr_Serializer[2])(serializer,0xd1,"input_table_names");
    Serializer::WriteValue<std::__cxx11::string>(serializer,&this->input_table_names);
    (*serializer->_vptr_Serializer[3])(serializer);
  }
  (*serializer->_vptr_Serializer[2])(serializer,0xd2,"projected_input");
  Serializer::WriteValue<unsigned_long>(serializer,&this->projected_input);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::ColumnIndex,true>>
            (serializer,0xd3,"column_indexes",&this->column_ids);
  return;
}

Assistant:

void LogicalGet::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WriteProperty(200, "table_index", table_index);
	serializer.WriteProperty(201, "returned_types", returned_types);
	serializer.WriteProperty(202, "names", names);
	/* [Deleted] (vector<column_t>) "column_ids" */
	serializer.WriteProperty(204, "projection_ids", projection_ids);
	serializer.WriteProperty(205, "table_filters", table_filters);
	FunctionSerializer::Serialize(serializer, function, bind_data.get());
	if (!function.serialize) {
		D_ASSERT(!function.serialize);
		// no serialize method: serialize input values and named_parameters for rebinding purposes
		serializer.WriteProperty(206, "parameters", parameters);
		serializer.WriteProperty(207, "named_parameters", named_parameters);
		serializer.WriteProperty(208, "input_table_types", input_table_types);
		serializer.WriteProperty(209, "input_table_names", input_table_names);
	}
	serializer.WriteProperty(210, "projected_input", projected_input);
	serializer.WritePropertyWithDefault(211, "column_indexes", column_ids);
}